

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O3

int os_system_linux_netlink_addreq
              (os_system_netlink *nl,nlmsghdr *nlmsg,int type,void *data,int len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(nlmsg->nlmsg_len + 3 & 0xfffffffc);
  uVar3 = (long)len + uVar2 + 4;
  if (uVar3 < 0x401) {
    *(short *)((long)&nlmsg->nlmsg_len + uVar2 + 2) = (short)type;
    *(short *)((long)&nlmsg->nlmsg_len + uVar2) = (short)len + 4;
    nlmsg->nlmsg_len = (__u32)uVar3;
    iVar1 = 0;
    if (len != 0) {
      memcpy((void *)((long)&nlmsg->nlmsg_type + uVar2),data,(long)len);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = -1;
    if (((&log_global_mask)[_oonf_os_system_subsystem.logging] & 4) != 0) {
      oonf_log(4,(ulong)_oonf_os_system_subsystem.logging,"src/base/os_linux/os_system_linux.c",
               0x1c2,0,0,"Netlink \'%s\' message got too large!",nl->name);
    }
  }
  return iVar1;
}

Assistant:

int
os_system_linux_netlink_addreq(
  struct os_system_netlink *nl, struct nlmsghdr *nlmsg, int type, const void *data, int len) {
  struct nlattr *nl_attr;
  size_t aligned_msg_len, aligned_attr_len;

  /* calculate aligned length of message and new attribute */
  aligned_msg_len = NLMSG_ALIGN(nlmsg->nlmsg_len);
  aligned_attr_len = NLA_HDRLEN + len;

  if (aligned_msg_len + aligned_attr_len > UIO_MAXIOV) {
    OONF_WARN(LOG_OS_SYSTEM, "Netlink '%s' message got too large!", nl->name);
    return -1;
  }

  nl_attr = (struct nlattr *)((void *)((char *)nlmsg + aligned_msg_len));
  nl_attr->nla_type = type;
  nl_attr->nla_len = aligned_attr_len;

  /* fix length of netlink message */
  nlmsg->nlmsg_len = aligned_msg_len + aligned_attr_len;

  if (len) {
    memcpy((char *)nl_attr + NLA_HDRLEN, data, len);
  }
  return 0;
}